

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eckey_impl.h
# Opt level: O2

int secp256k1_eckey_pubkey_parse(secp256k1_ge *elem,uchar *pub,size_t size)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  secp256k1_fe x;
  secp256k1_fe y;
  secp256k1_fe sStack_78;
  secp256k1_fe local_48;
  
  iVar1 = 0;
  if (size == 0x41) {
    if ((*pub < 8) && ((0xd0U >> (*pub & 0x1f) & 1) != 0)) {
      iVar2 = secp256k1_fe_set_b32_limit(&sStack_78,pub + 1);
      iVar1 = 0;
      if (((iVar2 != 0) && (iVar2 = secp256k1_fe_set_b32_limit(&local_48,pub + 0x21), iVar2 != 0))
         && ((secp256k1_ge_set_xy(elem,&sStack_78,&local_48), (*pub & 0xfe) != 6 ||
             (uVar3 = secp256k1_fe_is_odd(&local_48), uVar3 == (*pub == '\a'))))) {
        iVar1 = secp256k1_ge_is_valid_var(elem);
      }
    }
  }
  else {
    iVar1 = 0;
    if ((size == 0x21) && ((*pub & 0xfe) == 2)) {
      iVar1 = secp256k1_fe_set_b32_limit(&sStack_78,pub + 1);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        iVar1 = secp256k1_ge_set_xo_var(elem,&sStack_78,(uint)(*pub == '\x03'));
      }
    }
  }
  return iVar1;
}

Assistant:

static int secp256k1_eckey_pubkey_parse(secp256k1_ge *elem, const unsigned char *pub, size_t size) {
    if (size == 33 && (pub[0] == SECP256K1_TAG_PUBKEY_EVEN || pub[0] == SECP256K1_TAG_PUBKEY_ODD)) {
        secp256k1_fe x;
        return secp256k1_fe_set_b32_limit(&x, pub+1) && secp256k1_ge_set_xo_var(elem, &x, pub[0] == SECP256K1_TAG_PUBKEY_ODD);
    } else if (size == 65 && (pub[0] == SECP256K1_TAG_PUBKEY_UNCOMPRESSED || pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_EVEN || pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_ODD)) {
        secp256k1_fe x, y;
        if (!secp256k1_fe_set_b32_limit(&x, pub+1) || !secp256k1_fe_set_b32_limit(&y, pub+33)) {
            return 0;
        }
        secp256k1_ge_set_xy(elem, &x, &y);
        if ((pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_EVEN || pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_ODD) &&
            secp256k1_fe_is_odd(&y) != (pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_ODD)) {
            return 0;
        }
        return secp256k1_ge_is_valid_var(elem);
    } else {
        return 0;
    }
}